

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol.c
# Opt level: O1

int Test_SUNLinSolSolve(SUNLinearSolver S,SUNMatrix A,N_Vector x,N_Vector b,sunrealtype tol,
                       int zeroguess,int myid)

{
  uint uVar1;
  int iVar2;
  N_Vector Y;
  char *__format;
  
  Y = (N_Vector)N_VClone(x);
  if (zeroguess == 0) {
    N_VAddConst(0x3e50000000000000,x,Y);
  }
  else {
    N_VConst(0,Y);
  }
  sync_device();
  uVar1 = SUNLinSolSetZeroGuess(S,zeroguess);
  if (uVar1 == 0) {
    uVar1 = SUNLinSolSolve(tol,S,A,Y,b);
    sync_device();
    if (uVar1 == 0) {
      iVar2 = check_vector(x,Y,tol * 10.0);
      if (iVar2 == 0) {
        iVar2 = 0;
        if (myid != 0) goto LAB_00102977;
        puts("    PASSED test -- SUNLinSolSolve ");
        iVar2 = 0;
      }
      else {
        printf(">>> FAILED test -- SUNLinSolSolve check, Proc %d \n",(ulong)(uint)myid);
        iVar2 = 1;
      }
      if (print_time != 0) {
        printf("    SUNLinSolSolve Time: %22.15e \n \n",0);
      }
      goto LAB_00102977;
    }
    __format = ">>> FAILED test -- SUNLinSolSolve returned %d on Proc %d \n";
  }
  else {
    __format = ">>> FAILED test -- SUNLinSolSetZeroGuess returned %d on Proc %d \n";
  }
  printf(__format,(ulong)uVar1,(ulong)(uint)myid);
  iVar2 = 1;
LAB_00102977:
  N_VDestroy(Y);
  return iVar2;
}

Assistant:

int Test_SUNLinSolSolve(SUNLinearSolver S, SUNMatrix A, N_Vector x, N_Vector b,
                        sunrealtype tol, sunbooleantype zeroguess, int myid)
{
  int failure;
  double start_time, stop_time;
  N_Vector y;

  /* clone to create solution vector */
  y = N_VClone(x);

  /* set initial guess for the linear system */
  if (zeroguess) { N_VConst(ZERO, y); }
  else { N_VAddConst(x, SUNRsqrt(SUN_UNIT_ROUNDOFF), y); }

  sync_device();

  /* signal if the initial guess is zero or non-zero */
  failure = SUNLinSolSetZeroGuess(S, zeroguess);
  if (failure)
  {
    printf(">>> FAILED test -- SUNLinSolSetZeroGuess returned %d on Proc %d \n",
           failure, myid);
    N_VDestroy(y);
    return (1);
  }

  /* perform solve */
  start_time = get_time();
  failure    = SUNLinSolSolve(S, A, y, b, tol);
  sync_device();
  stop_time = get_time();
  if (failure)
  {
    printf(">>> FAILED test -- SUNLinSolSolve returned %d on Proc %d \n",
           failure, myid);
    N_VDestroy(y);
    return (1);
  }

  /* Check solution */
  failure = check_vector(x, y, 10.0 * tol);
  if (failure)
  {
    printf(">>> FAILED test -- SUNLinSolSolve check, Proc %d \n", myid);
    PRINT_TIME("    SUNLinSolSolve Time: %22.15e \n \n", stop_time - start_time);
    N_VDestroy(y);
    return (1);
  }
  else if (myid == 0)
  {
    printf("    PASSED test -- SUNLinSolSolve \n");
    PRINT_TIME("    SUNLinSolSolve Time: %22.15e \n \n", stop_time - start_time);
  }

  N_VDestroy(y);
  return (0);
}